

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testNNCompilerValidation(void)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  StringFeatureType *pSVar8;
  DictionaryFeatureType *pDVar9;
  TypeUnion TVar10;
  StringVector *this;
  Type *pTVar11;
  WeightParams *pWVar12;
  LayerUnion LVar13;
  ostream *poVar14;
  int iVar15;
  Result res;
  Model m1;
  string probsName;
  string featureName;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Model local_a0;
  string local_70;
  string local_50;
  
  CoreML::Specification::Model::Model(&local_a0);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar15 = (pAVar7->shape_).current_size_;
  if (iVar15 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar15 + 1);
    iVar15 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar15 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar15] = 1;
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7->datatype_ = 0x10040;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"middle","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar15 = (pAVar7->shape_).current_size_;
  if (iVar15 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar15 + 1);
    iVar15 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar15 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar15] = 1;
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7->datatype_ = 0x10040;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 3;
    pSVar8 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar8);
    (pFVar6->Type_).stringtype_ = pSVar8;
  }
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 6;
    pDVar9 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar9);
    (pFVar6->Type_).dictionarytype_ = pDVar9;
    pFVar6 = pTVar5->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 6) {
    pDVar9 = (pFVar6->Type_).dictionarytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 6;
    pDVar9 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar9);
    (pFVar6->Type_).dictionarytype_ = pDVar9;
  }
  if (pDVar9->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar9);
    pDVar9->_oneof_case_[0] = 2;
    pSVar8 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar8);
    (pDVar9->KeyType_).stringkeytype_ = pSVar8;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"features","");
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  psVar2 = ((local_a0.description_)->predictedfeaturename_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_a0.description_)->predictedfeaturename_,&local_50);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"probs","");
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_a0.description_ = pMVar4;
  }
  psVar2 = ((local_a0.description_)->predictedprobabilitiesname_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_a0.description_)->predictedprobabilitiesname_,&local_70);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (local_a0._oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 0x193;
    TVar10.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x68);
    CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier
              (TVar10.neuralnetworkclassifier_);
    local_a0.Type_.pipelineclassifier_ = TVar10.pipelineclassifier_;
  }
  TVar10 = local_a0.Type_;
  if (*(uint32 *)((long)&(local_a0.Type_.supportvectorclassifier_)->proba_ + 0xc) == 100) {
    this = ((ClassLabelsUnion *)&(local_a0.Type_.itemsimilarityrecommender_)->itemstringids_)->
           stringclasslabels_;
  }
  else {
    CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels
              (local_a0.Type_.neuralnetworkclassifier_);
    *(uint32 *)((long)&(TVar10.supportvectorclassifier_)->proba_ + 0xc) = 100;
    this = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(this);
    ((ClassLabelsUnion *)&(TVar10.itemsimilarityrecommender_)->itemstringids_)->stringclasslabels_ =
         this;
  }
  CoreML::Specification::StringVector::add_vector(this,"label1");
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar10.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar11,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar11,"middle");
  if (pTVar11->_oneof_case_[0] == 0x8c) {
    LVar13 = pTVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar11);
    pTVar11->_oneof_case_[0] = 0x8c;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar13.innerproduct_);
    (pTVar11->layer_).innerproduct_ = (InnerProductLayerParams *)LVar13;
  }
  (LVar13.innerproduct_)->inputchannels_ = 1;
  (LVar13.innerproduct_)->outputchannels_ = 1;
  pWVar12 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    ((LVar13.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar12;
  }
  iVar15 = (pWVar12->floatvalue_).current_size_;
  if (iVar15 == (pWVar12->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar12->floatvalue_,iVar15 + 1);
    iVar15 = (pWVar12->floatvalue_).current_size_;
  }
  (pWVar12->floatvalue_).current_size_ = iVar15 + 1;
  ((pWVar12->floatvalue_).rep_)->elements[iVar15] = 1.0;
  (LVar13.innerproduct_)->hasbias_ = false;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar10.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar11,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar11,"output");
  if (pTVar11->_oneof_case_[0] == 0x8c) {
    LVar13 = pTVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar11);
    pTVar11->_oneof_case_[0] = 0x8c;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar13.innerproduct_);
    (pTVar11->layer_).innerproduct_ = (InnerProductLayerParams *)LVar13;
  }
  (LVar13.innerproduct_)->hasbias_ = false;
  (LVar13.innerproduct_)->inputchannels_ = 1;
  (LVar13.innerproduct_)->outputchannels_ = 1;
  pWVar12 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    ((LVar13.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar12;
  }
  iVar15 = (pWVar12->floatvalue_).current_size_;
  if (iVar15 == (pWVar12->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar12->floatvalue_,iVar15 + 1);
    iVar15 = (pWVar12->floatvalue_).current_size_;
  }
  (pWVar12->floatvalue_).current_size_ = iVar15 + 1;
  ((pWVar12->floatvalue_).rep_)->elements[iVar15] = 1.0;
  CoreML::validate<(MLModelType)403>((Result *)local_c8,&local_a0);
  bVar3 = CoreML::Result::good((Result *)local_c8);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3e4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._8_8_ != &local_b0) {
    operator_delete((void *)local_c8._8_8_,local_b0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return (uint)!bVar3;
}

Assistant:

int testNNCompilerValidation() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);


    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(1);
    innerProductParams2->set_outputchannels(1);
    innerProductParams2->mutable_weights()->add_floatvalue(1.0);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_GOOD(res);
    return 0;

}